

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupNodes(Aig_Man_t *pMan,Vec_Ptr_t *vArray)

{
  char *__s;
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *__ptr;
  Aig_Man_t *p;
  size_t sVar3;
  char *__dest;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Aig_Obj_t *p1;
  long lVar6;
  
  if (vArray->nSize == 0) {
    p = (Aig_Man_t *)0x0;
  }
  else {
    __ptr = Aig_ManDfsNodes(pMan,(Aig_Obj_t **)vArray->pArray,vArray->nSize);
    p = Aig_ManStart(10000);
    __s = pMan->pName;
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar3 = strlen(__s);
      __dest = (char *)malloc(sVar3 + 1);
      strcpy(__dest,__s);
    }
    p->pName = __dest;
    pMan->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    iVar2 = __ptr->nSize;
    if (0 < iVar2) {
      lVar6 = 0;
      do {
        pvVar1 = __ptr->pArray[lVar6];
        if ((*(uint *)((long)pvVar1 + 0x18) & 7) == 2) {
          pAVar4 = Aig_ObjCreateCi(p);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
          iVar2 = __ptr->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar2);
      if (0 < iVar2) {
        lVar6 = 0;
        do {
          pvVar1 = __ptr->pArray[lVar6];
          if (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7) {
            if (((ulong)pvVar1 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
            }
            uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
            if (uVar5 == 0) {
              pAVar4 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar4 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
            }
            uVar5 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
            if (uVar5 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
            }
            pAVar4 = Aig_And(p,pAVar4,p1);
            *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
            iVar2 = __ptr->nSize;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar2);
      }
    }
    if (0 < vArray->nSize) {
      lVar6 = 0;
      do {
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)((long)vArray->pArray[lVar6] + 0x28));
        lVar6 = lVar6 + 1;
      } while (lVar6 < vArray->nSize);
    }
    Aig_ManSetRegNum(p,0);
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManDupNodes( Aig_Man_t * pMan, Vec_Ptr_t * vArray )
{
    Aig_Man_t * pNew;
    Vec_Ptr_t * vObjs;
    Aig_Obj_t * pObj = NULL;
    int i;
    if ( Vec_PtrSize(vArray) == 0 )
        return NULL;
    vObjs = Aig_ManDfsNodes( pMan, (Aig_Obj_t **)Vec_PtrArray(vArray), Vec_PtrSize(vArray) );
    // create the new manager
    pNew = Aig_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( pMan->pName );
    Aig_ManConst1(pMan)->pData = Aig_ManConst1(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pObj, i )
        if ( Aig_ObjIsCi(pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vArray, pObj, i )
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
    Aig_ManSetRegNum( pNew, 0 );
    Vec_PtrFree( vObjs );
    return pNew;
}